

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Marshal.c
# Opt level: O3

TPM_RC UINT8_Unmarshal(UINT8 *target,BYTE **buffer,INT32 *size)

{
  LOGGER_LOG p_Var1;
  int iVar2;
  
  if ((buffer == (BYTE **)0x0 || target == (UINT8 *)0x0) || size == (INT32 *)0x0) {
    p_Var1 = xlogging_get_log_function();
    if (p_Var1 == (LOGGER_LOG)0x0) {
      return 0x9a;
    }
    iVar2 = 0x26;
  }
  else {
    iVar2 = *size;
    *size = iVar2 + -1;
    if (0 < iVar2) {
      *target = **buffer;
      *buffer = *buffer + 1;
      return 0;
    }
    p_Var1 = xlogging_get_log_function();
    if (p_Var1 == (LOGGER_LOG)0x0) {
      return 0x9a;
    }
    iVar2 = 0x2d;
  }
  (*p_Var1)(AZ_LOG_ERROR,
            "/workspace/llm4binary/github/license_c_cmakelists/Azure[P]azure-utpm-c/src/Marshal.c",
            "UINT8_Unmarshal",iVar2,1,"invalid paramer specified");
  return 0x9a;
}

Assistant:

TPM_RC UINT8_Unmarshal(UINT8 *target, BYTE **buffer, INT32 *size)
{
    TPM_RC result;
    if (target == NULL || buffer == NULL || size == NULL)
    {
        LogError("invalid paramer specified");
        result = TPM_RC_INSUFFICIENT;
    }
    else
    {
        if ((*size -= 1) < 0)
        {
            LogError("invalid paramer specified");
            result = TPM_RC_INSUFFICIENT;
        }
        else
        {
            *target = BYTE_ARRAY_TO_UINT8(*buffer);
            *buffer += 1;
            result = TPM_RC_SUCCESS;
        }
    }
    return result;
}